

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_sstream.c
# Opt level: O2

HTS_Boolean
HTS_SStreamSet_create
          (HTS_SStreamSet *sss,HTS_ModelSet *ms,HTS_Label *label,HTS_Boolean phoneme_alignment_flag,
          double speed,double *duration_iw,double **parameter_iw,double **gv_iw)

{
  undefined8 *puVar1;
  HTS_Boolean HVar2;
  int iVar3;
  size_t sVar4;
  size_t *psVar5;
  HTS_SStream *pHVar6;
  double **ppdVar7;
  double *pdVar8;
  size_t sVar9;
  HTS_Boolean *pHVar10;
  double *vari;
  char *pcVar11;
  int *piVar12;
  void *pvVar13;
  undefined7 in_register_00000009;
  double **ppdVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double local_70;
  
  ppdVar14 = (double **)CONCAT71(in_register_00000009,phoneme_alignment_flag);
  sVar4 = HTS_Label_get_size(label);
  if (sVar4 != 0) {
    local_70 = 0.0;
    for (uVar16 = 0; sVar4 = HTS_ModelSet_get_nvoices(ms), uVar16 < sVar4; uVar16 = uVar16 + 1) {
      local_70 = local_70 + duration_iw[uVar16];
    }
    if ((local_70 != 0.0) || (NAN(local_70))) {
      if ((local_70 != 1.0) || (NAN(local_70))) {
        for (uVar16 = 0; sVar4 = HTS_ModelSet_get_nvoices(ms), uVar16 < sVar4; uVar16 = uVar16 + 1)
        {
          dVar21 = duration_iw[uVar16];
          if ((dVar21 != 0.0) || (NAN(dVar21))) {
            duration_iw[uVar16] = dVar21 / local_70;
          }
        }
      }
      uVar16 = 0;
      while( true ) {
        sVar4 = HTS_ModelSet_get_nstream(ms);
        if (sVar4 <= uVar16) {
          sVar4 = HTS_ModelSet_get_nstate(ms);
          sss->nstate = sVar4;
          sVar4 = HTS_ModelSet_get_nstream(ms);
          sss->nstream = sVar4;
          sss->total_frame = 0;
          sVar4 = HTS_Label_get_size(label);
          sVar4 = sVar4 * sss->nstate;
          sss->total_state = sVar4;
          psVar5 = (size_t *)HTS_calloc(sVar4,8);
          sss->duration = psVar5;
          pHVar6 = (HTS_SStream *)HTS_calloc(sss->nstream,0x60);
          sss->sstream = pHVar6;
          for (uVar16 = 0; uVar16 < sss->nstream; uVar16 = uVar16 + 1) {
            pHVar6 = sss->sstream;
            sVar4 = HTS_ModelSet_get_vector_length(ms,uVar16);
            pHVar6[uVar16].vector_length = sVar4;
            ppdVar7 = (double **)HTS_calloc(sss->total_state,8);
            pHVar6[uVar16].mean = ppdVar7;
            ppdVar7 = (double **)HTS_calloc(sss->total_state,8);
            pHVar6[uVar16].vari = ppdVar7;
            HVar2 = HTS_ModelSet_is_msd(ms,uVar16);
            if (HVar2 == '\0') {
              pdVar8 = (double *)0x0;
            }
            else {
              pdVar8 = (double *)HTS_calloc(sss->total_state,8);
            }
            pHVar6 = pHVar6 + uVar16;
            pHVar6->msd = pdVar8;
            for (uVar17 = 0; uVar17 < sss->total_state; uVar17 = uVar17 + 1) {
              sVar4 = pHVar6->vector_length;
              sVar9 = HTS_ModelSet_get_window_size(ms,uVar16);
              pdVar8 = (double *)HTS_calloc(sVar4 * sVar9,8);
              pHVar6->mean[uVar17] = pdVar8;
              sVar4 = pHVar6->vector_length;
              sVar9 = HTS_ModelSet_get_window_size(ms,uVar16);
              pdVar8 = (double *)HTS_calloc(sVar4 * sVar9,8);
              ppdVar14 = pHVar6->vari;
              ppdVar14[uVar17] = pdVar8;
            }
            HVar2 = HTS_ModelSet_use_gv(ms,uVar16);
            if (HVar2 == '\0') {
              pHVar6->gv_switch = (HTS_Boolean *)0x0;
            }
            else {
              pHVar10 = (HTS_Boolean *)HTS_calloc(sss->total_state,1);
              pHVar6->gv_switch = pHVar10;
              for (uVar17 = 0; uVar17 < sss->total_state; uVar17 = uVar17 + 1) {
                ppdVar14 = (double **)pHVar6->gv_switch;
                *(undefined1 *)((long)ppdVar14 + uVar17) = 1;
              }
            }
          }
          pdVar8 = (double *)HTS_calloc(sss->total_state,8);
          vari = (double *)HTS_calloc(sss->total_state,8);
          for (uVar16 = 0; sVar4 = HTS_Label_get_size(label), uVar16 < sVar4; uVar16 = uVar16 + 1) {
            pcVar11 = HTS_Label_get_string(label,uVar16);
            lVar15 = sss->nstate * uVar16;
            ppdVar14 = (double **)(pdVar8 + lVar15);
            HTS_ModelSet_get_duration(ms,pcVar11,duration_iw,(double *)ppdVar14,vari + lVar15);
          }
          if (phoneme_alignment_flag == '\x01') {
            lVar15 = 0;
            lVar19 = 0;
            lVar20 = 0;
            for (uVar16 = 0; sVar4 = HTS_Label_get_size(label), uVar16 < sVar4; uVar16 = uVar16 + 1)
            {
              dVar21 = HTS_Label_get_end_frame(label,uVar16);
              if (0.0 <= dVar21) {
                auVar22._8_4_ = (int)((ulong)lVar19 >> 0x20);
                auVar22._0_8_ = lVar19;
                auVar22._12_4_ = 0x45300000;
                dVar21 = HTS_set_specified_duration
                                   (sss->duration + lVar20,pdVar8 + lVar20,vari + lVar20,
                                    (lVar15 - lVar20) + sss->nstate,
                                    dVar21 - ((auVar22._8_8_ - 1.9342813113834067e+25) +
                                             ((double)CONCAT44(0x43300000,(int)lVar19) -
                                             4503599627370496.0)));
                ppdVar14 = (double **)((long)dVar21 >> 0x3f);
                lVar19 = lVar19 + ((long)(dVar21 - 9.223372036854776e+18) & (ulong)ppdVar14 |
                                  (long)dVar21);
                lVar20 = sss->nstate + lVar15;
              }
              else {
                sVar4 = HTS_Label_get_size(label);
                if (uVar16 + 1 == sVar4) {
                  HTS_error(-1,"HTS_SStreamSet_create: The time of final label is not specified.\n")
                  ;
                  HTS_set_default_duration
                            (sss->duration + lVar20,pdVar8 + lVar20,
                             (double *)((lVar15 - lVar20) + sss->nstate),(size_t)ppdVar14);
                }
              }
              lVar15 = lVar15 + sss->nstate;
            }
          }
          else if ((speed != 1.0) || (NAN(speed))) {
            dVar21 = 0.0;
            for (sVar4 = 0; sss->total_state != sVar4; sVar4 = sVar4 + 1) {
              dVar21 = dVar21 + pdVar8[sVar4];
            }
            HTS_set_specified_duration(sss->duration,pdVar8,vari,sss->total_state,dVar21 / speed);
          }
          else {
            HTS_set_default_duration
                      (sss->duration,pdVar8,(double *)sss->total_state,(size_t)ppdVar14);
          }
          HTS_free(pdVar8);
          HTS_free(vari);
          lVar15 = 0;
          for (uVar16 = 0; sVar4 = HTS_Label_get_size(label), uVar16 < sVar4; uVar16 = uVar16 + 1) {
            for (uVar17 = 2; uVar17 <= sss->nstate + 1; uVar17 = uVar17 + 1) {
              sss->total_frame = sss->total_frame + sss->duration[lVar15];
              lVar19 = 0x18;
              for (uVar18 = 0; uVar18 < sss->nstream; uVar18 = uVar18 + 1) {
                pHVar6 = sss->sstream;
                lVar20 = *(long *)((long)&pHVar6->vector_length + lVar19);
                pcVar11 = HTS_Label_get_string(label,uVar16);
                if (lVar20 == 0) {
                  pdVar8 = (double *)0x0;
                }
                else {
                  pdVar8 = (double *)(*(long *)((long)&pHVar6->vector_length + lVar19) + lVar15 * 8)
                  ;
                }
                HTS_ModelSet_get_parameter
                          (ms,uVar18,uVar17,pcVar11,parameter_iw,
                           *(double **)(*(long *)((long)pHVar6 + lVar19 + -0x10) + lVar15 * 8),
                           *(double **)(*(long *)((long)pHVar6 + lVar19 + -8) + lVar15 * 8),pdVar8);
                lVar19 = lVar19 + 0x60;
              }
              lVar15 = lVar15 + 1;
            }
          }
          for (uVar16 = 0; uVar17 = sss->nstream, uVar16 < uVar17; uVar16 = uVar16 + 1) {
            pHVar6 = sss->sstream;
            sVar4 = HTS_ModelSet_get_window_size(ms,uVar16);
            pHVar6[uVar16].win_size = sVar4;
            sVar4 = HTS_ModelSet_get_window_max_width(ms,uVar16);
            pHVar6[uVar16].win_max_width = sVar4;
            piVar12 = (int *)HTS_calloc(pHVar6[uVar16].win_size,4);
            pHVar6[uVar16].win_l_width = piVar12;
            piVar12 = (int *)HTS_calloc(pHVar6[uVar16].win_size,4);
            pHVar6[uVar16].win_r_width = piVar12;
            ppdVar14 = (double **)HTS_calloc(pHVar6[uVar16].win_size,8);
            pHVar6[uVar16].win_coefficient = ppdVar14;
            for (uVar17 = 0; uVar17 < pHVar6[uVar16].win_size; uVar17 = uVar17 + 1) {
              iVar3 = HTS_ModelSet_get_window_left_width(ms,uVar16,uVar17);
              pHVar6[uVar16].win_l_width[uVar17] = iVar3;
              iVar3 = HTS_ModelSet_get_window_right_width(ms,uVar16,uVar17);
              pHVar6[uVar16].win_r_width[uVar17] = iVar3;
              pdVar8 = (double *)
                       HTS_calloc((long)(int)((uint)(iVar3 + pHVar6[uVar16].win_l_width[uVar17] == 0
                                                    ) + pHVar6[uVar16].win_l_width[uVar17] * -2),8);
              pHVar6[uVar16].win_coefficient[uVar17] = pdVar8;
              pHVar6[uVar16].win_coefficient[uVar17] =
                   pHVar6[uVar16].win_coefficient[uVar17] +
                   -(long)pHVar6[uVar16].win_l_width[uVar17];
              for (sVar4 = (size_t)pHVar6[uVar16].win_l_width[uVar17];
                  (long)sVar4 <= (long)pHVar6[uVar16].win_r_width[uVar17]; sVar4 = sVar4 + 1) {
                dVar21 = HTS_ModelSet_get_window_coefficient(ms,uVar16,uVar17,sVar4);
                pHVar6[uVar16].win_coefficient[uVar17][sVar4] = dVar21;
              }
            }
          }
          lVar15 = 0x50;
          for (uVar16 = 0; uVar16 < uVar17; uVar16 = uVar16 + 1) {
            pHVar6 = sss->sstream;
            HVar2 = HTS_ModelSet_use_gv(ms,uVar16);
            if (HVar2 == '\0') {
              puVar1 = (undefined8 *)((long)pHVar6 + lVar15 + -8);
              *puVar1 = 0;
              puVar1[1] = 0;
            }
            else {
              pvVar13 = HTS_calloc(*(size_t *)((long)pHVar6 + lVar15 + -0x50),8);
              *(void **)((long)pHVar6 + lVar15 + -8) = pvVar13;
              pvVar13 = HTS_calloc(*(size_t *)((long)pHVar6 + lVar15 + -0x50),8);
              *(void **)((long)&pHVar6->vector_length + lVar15) = pvVar13;
              pcVar11 = HTS_Label_get_string(label,0);
              HTS_ModelSet_get_gv(ms,uVar16,pcVar11,gv_iw,*(double **)((long)pHVar6 + lVar15 + -8),
                                  *(double **)((long)&pHVar6->vector_length + lVar15));
            }
            uVar17 = sss->nstream;
            lVar15 = lVar15 + 0x60;
          }
          for (uVar16 = 0; sVar4 = HTS_Label_get_size(label), uVar16 < sVar4; uVar16 = uVar16 + 1) {
            pcVar11 = HTS_Label_get_string(label,uVar16);
            HVar2 = HTS_ModelSet_get_gv_flag(ms,pcVar11);
            if (HVar2 == '\0') {
              for (uVar17 = 0; uVar17 < sss->nstream; uVar17 = uVar17 + 1) {
                HVar2 = HTS_ModelSet_use_gv(ms,uVar17);
                if (HVar2 == '\x01') {
                  for (uVar18 = 0; uVar18 < sss->nstate; uVar18 = uVar18 + 1) {
                    sss->sstream[uVar17].gv_switch[uVar18 + sss->nstate * uVar16] = '\0';
                  }
                }
              }
            }
          }
          return '\x01';
        }
        local_70 = 0.0;
        for (uVar17 = 0; sVar4 = HTS_ModelSet_get_nvoices(ms), uVar17 < sVar4; uVar17 = uVar17 + 1)
        {
          local_70 = local_70 + parameter_iw[uVar17][uVar16];
        }
        if ((local_70 == 0.0) && (!NAN(local_70))) break;
        if ((local_70 != 1.0) || (NAN(local_70))) {
          for (uVar17 = 0; sVar4 = HTS_ModelSet_get_nvoices(ms), uVar17 < sVar4; uVar17 = uVar17 + 1
              ) {
            dVar21 = parameter_iw[uVar17][uVar16];
            if ((dVar21 != 0.0) || (NAN(dVar21))) {
              parameter_iw[uVar17][uVar16] = dVar21 / local_70;
            }
          }
        }
        HVar2 = HTS_ModelSet_use_gv(ms,uVar16);
        if (HVar2 != '\0') {
          local_70 = 0.0;
          for (uVar17 = 0; sVar4 = HTS_ModelSet_get_nvoices(ms), uVar17 < sVar4; uVar17 = uVar17 + 1
              ) {
            local_70 = local_70 + gv_iw[uVar17][uVar16];
          }
          if ((local_70 == 0.0) && (!NAN(local_70))) {
            return '\0';
          }
          if ((local_70 != 1.0) || (NAN(local_70))) {
            for (uVar17 = 0; sVar4 = HTS_ModelSet_get_nvoices(ms), uVar17 < sVar4;
                uVar17 = uVar17 + 1) {
              dVar21 = gv_iw[uVar17][uVar16];
              if ((dVar21 != 0.0) || (NAN(dVar21))) {
                gv_iw[uVar17][uVar16] = dVar21 / local_70;
              }
            }
          }
        }
        uVar16 = uVar16 + 1;
      }
    }
  }
  return '\0';
}

Assistant:

HTS_Boolean HTS_SStreamSet_create(HTS_SStreamSet * sss, HTS_ModelSet * ms, HTS_Label * label, HTS_Boolean phoneme_alignment_flag, double speed, double *duration_iw, double **parameter_iw, double **gv_iw)
{
   size_t i, j, k;
   double temp;
   int shift;
   size_t state;
   HTS_SStream *sst;
   double *duration_mean, *duration_vari;
   double frame_length;
   size_t next_time;
   size_t next_state;

   if (HTS_Label_get_size(label) == 0)
      return FALSE;

   /* check interpolation weights */
   for (i = 0, temp = 0.0; i < HTS_ModelSet_get_nvoices(ms); i++)
      temp += duration_iw[i];
   if (temp == 0.0) {
      return FALSE;
   } else if (temp != 1.0) {
      for (i = 0; i < HTS_ModelSet_get_nvoices(ms); i++)
         if (duration_iw[i] != 0.0)
            duration_iw[i] /= temp;
   }

   for (i = 0; i < HTS_ModelSet_get_nstream(ms); i++) {
      for (j = 0, temp = 0.0; j < HTS_ModelSet_get_nvoices(ms); j++)
         temp += parameter_iw[j][i];
      if (temp == 0.0) {
         return FALSE;
      } else if (temp != 1.0) {
         for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++)
            if (parameter_iw[j][i] != 0.0)
               parameter_iw[j][i] /= temp;
      }
      if (HTS_ModelSet_use_gv(ms, i)) {
         for (j = 0, temp = 0.0; j < HTS_ModelSet_get_nvoices(ms); j++)
            temp += gv_iw[j][i];
         if (temp == 0.0)
            return FALSE;
         else if (temp != 1.0)
            for (j = 0; j < HTS_ModelSet_get_nvoices(ms); j++)
               if (gv_iw[j][i] != 0.0)
                  gv_iw[j][i] /= temp;
      }
   }

   /* initialize state sequence */
   sss->nstate = HTS_ModelSet_get_nstate(ms);
   sss->nstream = HTS_ModelSet_get_nstream(ms);
   sss->total_frame = 0;
   sss->total_state = HTS_Label_get_size(label) * sss->nstate;
   sss->duration = (size_t *) HTS_calloc(sss->total_state, sizeof(size_t));
   sss->sstream = (HTS_SStream *) HTS_calloc(sss->nstream, sizeof(HTS_SStream));
   for (i = 0; i < sss->nstream; i++) {
      sst = &sss->sstream[i];
      sst->vector_length = HTS_ModelSet_get_vector_length(ms, i);
      sst->mean = (double **) HTS_calloc(sss->total_state, sizeof(double *));
      sst->vari = (double **) HTS_calloc(sss->total_state, sizeof(double *));
      if (HTS_ModelSet_is_msd(ms, i))
         sst->msd = (double *) HTS_calloc(sss->total_state, sizeof(double));
      else
         sst->msd = NULL;
      for (j = 0; j < sss->total_state; j++) {
         sst->mean[j] = (double *) HTS_calloc(sst->vector_length * HTS_ModelSet_get_window_size(ms, i), sizeof(double));
         sst->vari[j] = (double *) HTS_calloc(sst->vector_length * HTS_ModelSet_get_window_size(ms, i), sizeof(double));
      }
      if (HTS_ModelSet_use_gv(ms, i)) {
         sst->gv_switch = (HTS_Boolean *) HTS_calloc(sss->total_state, sizeof(HTS_Boolean));
         for (j = 0; j < sss->total_state; j++)
            sst->gv_switch[j] = TRUE;
      } else {
         sst->gv_switch = NULL;
      }
   }

   /* determine state duration */
   duration_mean = (double *) HTS_calloc(sss->total_state, sizeof(double));
   duration_vari = (double *) HTS_calloc(sss->total_state, sizeof(double));
   for (i = 0; i < HTS_Label_get_size(label); i++)
      HTS_ModelSet_get_duration(ms, HTS_Label_get_string(label, i), duration_iw, &duration_mean[i * sss->nstate], &duration_vari[i * sss->nstate]);
   if (phoneme_alignment_flag == TRUE) {
      /* use duration set by user */
      next_time = 0;
      next_state = 0;
      state = 0;
      for (i = 0; i < HTS_Label_get_size(label); i++) {
         temp = HTS_Label_get_end_frame(label, i);
         if (temp >= 0) {
            next_time += (size_t) HTS_set_specified_duration(&sss->duration[next_state], &duration_mean[next_state], &duration_vari[next_state], state + sss->nstate - next_state, temp - next_time);
            next_state = state + sss->nstate;
         } else if (i + 1 == HTS_Label_get_size(label)) {
            HTS_error(-1, "HTS_SStreamSet_create: The time of final label is not specified.\n");
            HTS_set_default_duration(&sss->duration[next_state], &duration_mean[next_state], &duration_vari[next_state], state + sss->nstate - next_state);
         }
         state += sss->nstate;
      }
   } else {
      /* determine frame length */
      if (speed != 1.0) {
         temp = 0.0;
         for (i = 0; i < sss->total_state; i++) {
            temp += duration_mean[i];
         }
         frame_length = temp / speed;
         HTS_set_specified_duration(sss->duration, duration_mean, duration_vari, sss->total_state, frame_length);
      } else {
         HTS_set_default_duration(sss->duration, duration_mean, duration_vari, sss->total_state);
      }
   }
   HTS_free(duration_mean);
   HTS_free(duration_vari);

   /* get parameter */
   for (i = 0, state = 0; i < HTS_Label_get_size(label); i++) {
      for (j = 2; j <= sss->nstate + 1; j++) {
         sss->total_frame += sss->duration[state];
         for (k = 0; k < sss->nstream; k++) {
            sst = &sss->sstream[k];
            if (sst->msd)
               HTS_ModelSet_get_parameter(ms, k, j, HTS_Label_get_string(label, i), (const double *const *) parameter_iw, sst->mean[state], sst->vari[state], &sst->msd[state]);
            else
               HTS_ModelSet_get_parameter(ms, k, j, HTS_Label_get_string(label, i), (const double *const *) parameter_iw, sst->mean[state], sst->vari[state], NULL);
         }
         state++;
      }
   }

   /* copy dynamic window */
   for (i = 0; i < sss->nstream; i++) {
      sst = &sss->sstream[i];
      sst->win_size = HTS_ModelSet_get_window_size(ms, i);
      sst->win_max_width = HTS_ModelSet_get_window_max_width(ms, i);
      sst->win_l_width = (int *) HTS_calloc(sst->win_size, sizeof(int));
      sst->win_r_width = (int *) HTS_calloc(sst->win_size, sizeof(int));
      sst->win_coefficient = (double **) HTS_calloc(sst->win_size, sizeof(double));
      for (j = 0; j < sst->win_size; j++) {
         sst->win_l_width[j] = HTS_ModelSet_get_window_left_width(ms, i, j);
         sst->win_r_width[j] = HTS_ModelSet_get_window_right_width(ms, i, j);
         if (sst->win_l_width[j] + sst->win_r_width[j] == 0)
            sst->win_coefficient[j] = (double *) HTS_calloc(-2 * sst->win_l_width[j] + 1, sizeof(double));
         else
            sst->win_coefficient[j] = (double *) HTS_calloc(-2 * sst->win_l_width[j], sizeof(double));
         sst->win_coefficient[j] -= sst->win_l_width[j];
         for (shift = sst->win_l_width[j]; shift <= sst->win_r_width[j]; shift++)
            sst->win_coefficient[j][shift] = HTS_ModelSet_get_window_coefficient(ms, i, j, shift);
      }
   }

   /* determine GV */
   for (i = 0; i < sss->nstream; i++) {
      sst = &sss->sstream[i];
      if (HTS_ModelSet_use_gv(ms, i)) {
         sst->gv_mean = (double *) HTS_calloc(sst->vector_length, sizeof(double));
         sst->gv_vari = (double *) HTS_calloc(sst->vector_length, sizeof(double));
         HTS_ModelSet_get_gv(ms, i, HTS_Label_get_string(label, 0), (const double *const *) gv_iw, sst->gv_mean, sst->gv_vari);
      } else {
         sst->gv_mean = NULL;
         sst->gv_vari = NULL;
      }
   }

   for (i = 0; i < HTS_Label_get_size(label); i++)
      if (HTS_ModelSet_get_gv_flag(ms, HTS_Label_get_string(label, i)) == FALSE)
         for (j = 0; j < sss->nstream; j++)
            if (HTS_ModelSet_use_gv(ms, j) == TRUE)
               for (k = 0; k < sss->nstate; k++)
                  sss->sstream[j].gv_switch[i * sss->nstate + k] = FALSE;

   return TRUE;
}